

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O0

int AF_A_Burnination(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *ent;
  int iVar1;
  uint uVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  bool local_c6;
  bool local_c3;
  TVector3<double> local_c0;
  APhosphorousFire *local_a8;
  AActor *drop;
  TVector2<double> local_88;
  sector_t *local_78;
  sector_t *sector;
  DVector2 pos;
  int yrand;
  int yofs;
  int xrand;
  int xofs;
  DThinker *local_48;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_18;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_18 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                  ,0x277,"int AF_A_Burnination(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar3) {
    stateowner = (AActor *)(param->field_0).field_1.a;
    local_c3 = true;
    if (stateowner != (AActor *)0x0) {
      local_c3 = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
    }
    if (local_c3 != false) {
      self._0_4_ = (int)self + 1;
      if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
        bVar3 = false;
        if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
           (bVar3 = true, pVStack_18[(int)self].field_0.field_1.atag != 1)) {
          bVar3 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar3) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                        ,0x277,
                        "int AF_A_Burnination(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
        stateinfo = (FStateParamInfo *)pVStack_18[(int)self].field_0.field_1.a;
        local_c6 = true;
        if ((DObject *)stateinfo != (DObject *)0x0) {
          local_c6 = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
        }
        if (local_c6 == false) {
          __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                        ,0x277,
                        "int AF_A_Burnination(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      else {
        stateinfo = (FStateParamInfo *)stateowner;
      }
      self._0_4_ = (int)self + 1;
      if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
        bVar3 = false;
        if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
           (bVar3 = true, pVStack_18[(int)self].field_0.field_1.atag != 8)) {
          bVar3 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar3) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                        ,0x277,
                        "int AF_A_Burnination(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
        local_48 = (DThinker *)pVStack_18[(int)self].field_0.field_1.a;
      }
      else {
        local_48 = (DThinker *)0x0;
      }
      (stateowner->Vel).Z = (stateowner->Vel).Z - 8.0;
      iVar1 = FRandom::Random2(&pr_phburn,3);
      (stateowner->Vel).X = (double)iVar1 + (stateowner->Vel).X;
      iVar1 = FRandom::Random2(&pr_phburn,3);
      ent = stateowner;
      (stateowner->Vel).Y = (double)iVar1 + (stateowner->Vel).Y;
      FSoundID::FSoundID((FSoundID *)&xofs,"world/largefire");
      S_Sound(ent,2,(FSoundID *)&xofs,1.0,1.0);
      TFlags<ActorFlag,_unsigned_int>::operator&
                ((TFlags<ActorFlag,_unsigned_int> *)&xrand,
                 (int)stateowner + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
      uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&xrand);
      if (uVar2 == 0) {
        uVar2 = FRandom::operator()(&pr_phburn);
        pos.Y._0_4_ = FRandom::operator()(&pr_phburn);
        yofs = uVar2 & 0x1f;
        if ((uVar2 & 0x80) != 0) {
          yofs = -yofs;
        }
        pos.Y._4_4_ = pos.Y._0_4_ & 0x1f;
        if ((pos.Y._0_4_ & 0x80) != 0) {
          pos.Y._4_4_ = -pos.Y._4_4_;
        }
        AActor::Vec2Offset((AActor *)&sector,(double)yofs,(double)(int)pos.Y._4_4_,
                           SUB81(stateowner,0));
        local_78 = P_PointInSector((DVector2 *)&sector);
        dVar4 = secplane_t::ZatPoint(&local_78->floorplane,(DVector2 *)&sector);
        dVar5 = AActor::Z(stateowner);
        if (dVar5 + stateowner->MaxStepHeight < dVar4) {
          AActor::Pos((DVector3 *)&drop,stateowner);
          TVector2<double>::TVector2(&local_88,(TVector3<double> *)&drop);
          TVector2<double>::operator=((TVector2<double> *)&sector,&local_88);
        }
        dVar4 = AActor::Z(stateowner);
        TVector3<double>::TVector3(&local_c0,(Vector2 *)&sector,dVar4 + 4.0);
        local_a8 = Spawn<APhosphorousFire>(&local_c0,ALLOW_REPLACE);
        if (local_a8 != (APhosphorousFire *)0x0) {
          dVar4 = (stateowner->Vel).X;
          iVar1 = FRandom::Random2(&pr_phburn,7);
          (local_a8->super_AActor).Vel.X = dVar4 + (double)iVar1;
          dVar4 = (stateowner->Vel).Y;
          iVar1 = FRandom::Random2(&pr_phburn,7);
          (local_a8->super_AActor).Vel.Y = dVar4 + (double)iVar1;
          (local_a8->super_AActor).Vel.Z = (stateowner->Vel).Z - 1.0;
          uVar2 = FRandom::operator()(&pr_phburn);
          (local_a8->super_AActor).reactiontime = (uVar2 & 3) + 2;
          TFlags<ActorFlag,_unsigned_int>::operator|=(&(local_a8->super_AActor).flags,MF_DROPPED);
        }
      }
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                  ,0x277,"int AF_A_Burnination(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                ,0x277,"int AF_A_Burnination(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Burnination)
{
	PARAM_ACTION_PROLOGUE;

	self->Vel.Z -= 8;
	self->Vel.X += (pr_phburn.Random2 (3));
	self->Vel.Y += (pr_phburn.Random2 (3));
	S_Sound (self, CHAN_VOICE, "world/largefire", 1, ATTN_NORM);

	// Only the main fire spawns more.
	if (!(self->flags & MF_DROPPED))
	{
		// Original x and y offsets seemed to be like this:
		//		x + (((pr_phburn() + 12) & 31) << F.RACBITS);
		//
		// But that creates a lop-sided burn because it won't use negative offsets.
		int xofs, xrand = pr_phburn();
		int yofs, yrand = pr_phburn();

		// Adding 12 is pointless if you're going to mask it afterward.
		xofs = xrand & 31;
		if (xrand & 128)
		{
			xofs = -xofs;
		}

		yofs = yrand & 31;
		if (yrand & 128)
		{
			yofs = -yofs;
		}

		DVector2 pos = self->Vec2Offset((double)xofs, (double)yofs);
		sector_t * sector = P_PointInSector(pos);

		// The sector's floor is too high so spawn the flame elsewhere.
		if (sector->floorplane.ZatPoint(pos) > self->Z() + self->MaxStepHeight)
		{
			pos = self->Pos();
		}

		AActor *drop = Spawn<APhosphorousFire> (DVector3(pos, self->Z() + 4.), ALLOW_REPLACE);
		if (drop != NULL)
		{
			drop->Vel.X = self->Vel.X + pr_phburn.Random2 (7);
			drop->Vel.Y = self->Vel.Y + pr_phburn.Random2 (7);
			drop->Vel.Z = self->Vel.Z - 1;
			drop->reactiontime = (pr_phburn() & 3) + 2;
			drop->flags |= MF_DROPPED;
		}
	}
	return 0;
}